

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

ON_OBSOLETE_V5_Annotation *
ON_OBSOLETE_V5_Annotation::CreateFromV6Annotation
          (ON_Annotation *V6_annotation,ON_3dmAnnotationContext *annotation_context)

{
  ON_Text *V6_text_object;
  ON_OBSOLETE_V5_Annotation *pOVar1;
  ON_Leader *V6_leader;
  ON_DimRadial *V6_dim_radial;
  ON_DimLinear *V6_dim_linear;
  ON_DimAngular *V6_dim_angular;
  ON_OBSOLETE_V5_DimAngular *pOVar2;
  ON_DimOrdinate *V6_dim_ordinate;
  ON_OBSOLETE_V5_DimOrdinate *pOVar3;
  
  V6_text_object = ON_Text::Cast((ON_Object *)V6_annotation);
  if (V6_text_object != (ON_Text *)0x0) {
    pOVar1 = &ON_OBSOLETE_V5_TextObject::CreateFromV6TextObject
                        (V6_text_object,annotation_context,(ON_OBSOLETE_V5_TextObject *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar1;
  }
  V6_leader = ON_Leader::Cast((ON_Object *)V6_annotation);
  if (V6_leader != (ON_Leader *)0x0) {
    pOVar1 = &ON_OBSOLETE_V5_Leader::CreateFromV6Leader
                        (V6_leader,annotation_context,(ON_OBSOLETE_V5_Leader *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar1;
  }
  V6_dim_radial = ON_DimRadial::Cast((ON_Object *)V6_annotation);
  if (V6_dim_radial != (ON_DimRadial *)0x0) {
    pOVar1 = &ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial
                        (V6_dim_radial,annotation_context,(ON_OBSOLETE_V5_DimRadial *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar1;
  }
  V6_dim_linear = ON_DimLinear::Cast((ON_Object *)V6_annotation);
  if (V6_dim_linear != (ON_DimLinear *)0x0) {
    pOVar1 = &ON_OBSOLETE_V5_DimLinear::CreateFromV6DimLinear
                        (V6_dim_linear,annotation_context,(ON_OBSOLETE_V5_DimLinear *)0x0)->
              super_ON_OBSOLETE_V5_Annotation;
    return pOVar1;
  }
  V6_dim_angular = ON_DimAngular::Cast((ON_Object *)V6_annotation);
  if (V6_dim_angular != (ON_DimAngular *)0x0) {
    pOVar2 = ON_OBSOLETE_V5_DimAngular::CreateFromV6DimAngular
                       (V6_dim_angular,annotation_context,(ON_OBSOLETE_V5_DimAngular *)0x0);
    return &pOVar2->super_ON_OBSOLETE_V5_Annotation;
  }
  V6_dim_ordinate = ON_DimOrdinate::Cast((ON_Object *)V6_annotation);
  if (V6_dim_ordinate != (ON_DimOrdinate *)0x0) {
    pOVar3 = ON_OBSOLETE_V5_DimOrdinate::CreateFromV6DimOrdinate
                       (V6_dim_ordinate,annotation_context,(ON_OBSOLETE_V5_DimOrdinate *)0x0);
    return &pOVar3->super_ON_OBSOLETE_V5_Annotation;
  }
  return (ON_OBSOLETE_V5_Annotation *)0x0;
}

Assistant:

ON_OBSOLETE_V5_Annotation* ON_OBSOLETE_V5_Annotation::CreateFromV6Annotation(
  const class ON_Annotation& V6_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  const ON_Text* V6_text_object = ON_Text::Cast(&V6_annotation);
  if (nullptr != V6_text_object)
    return ON_OBSOLETE_V5_TextObject::CreateFromV6TextObject(*V6_text_object, annotation_context, nullptr);

  const ON_Leader* V6_leader = ON_Leader::Cast(&V6_annotation);
  if (nullptr != V6_leader)
    return ON_OBSOLETE_V5_Leader::CreateFromV6Leader(*V6_leader, annotation_context, nullptr);

  const ON_DimRadial* V6_dim_radial = ON_DimRadial::Cast(&V6_annotation);
  if (nullptr != V6_dim_radial)
    return ON_OBSOLETE_V5_DimRadial::CreateFromV6DimRadial(*V6_dim_radial, annotation_context, nullptr);

  const ON_DimLinear* V6_dim_linear = ON_DimLinear::Cast(&V6_annotation);
  if (nullptr != V6_dim_linear)
    return ON_OBSOLETE_V5_DimLinear::CreateFromV6DimLinear(*V6_dim_linear, annotation_context, nullptr);

  const ON_DimAngular* V6_dim_angle = ON_DimAngular::Cast(&V6_annotation);
  if (nullptr != V6_dim_angle)
    return ON_OBSOLETE_V5_DimAngular::CreateFromV6DimAngular(*V6_dim_angle, annotation_context, nullptr);

  const ON_DimOrdinate* V6_dim_ordinate = ON_DimOrdinate::Cast(&V6_annotation);
  if (nullptr != V6_dim_ordinate)
    return ON_OBSOLETE_V5_DimOrdinate::CreateFromV6DimOrdinate(*V6_dim_ordinate, annotation_context, nullptr);

  return nullptr;
}